

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall TPZMatrix<long_double>::Input(TPZMatrix<long_double> *this,istream *in)

{
  long lVar1;
  long lVar2;
  int64_t newCol;
  int64_t newRow;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  std::istream::_M_extract<long>((long *)in);
  std::istream::_M_extract<long>((long *)in);
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xe])(this,local_40,local_48);
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar2 = 0;
    do {
      if (0 < (this->super_TPZBaseMatrix).fCol) {
        lVar1 = 0;
        do {
          std::istream::_M_extract<long_double>((longdouble *)in);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x20])
                    (this,lVar2,lVar1,local_38);
          lVar1 = lVar1 + 1;
        } while (lVar1 < (this->super_TPZBaseMatrix).fCol);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Input(std::istream& in )
{
  if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                std::is_same<TVar, Fad<float>>::value ||
                std::is_same<TVar, Fad<double>>::value ||
                std::is_same<TVar, Fad<long double>>::value ||
                std::is_same<TVar, TPZFlopCounter>::value) {
    PZError << __PRETTY_FUNCTION__;
    PZError << " not implemented for this type\n";
    PZError << "Aborting...";
    DebugStop();
  }
    int64_t newRow, newCol;
	in >> newRow;
	in >> newCol;
	Redim( newRow, newCol );
	int64_t i,j;
	TVar elem;
	for(i=0;i<Rows();i++)
		for(j=0;j<Cols();j++)
		{
			in >> elem;
			Put( i,j, elem );
		}
}